

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

Literal * __thiscall
wasm::Literal::subSatSI16(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  short sVar1;
  int32_t iVar2;
  int32_t iVar3;
  Literal *other_local;
  Literal *this_local;
  
  iVar2 = geti32(this);
  iVar3 = geti32(other);
  sVar1 = sub_sat_s<short>((short)iVar2,(short)iVar3);
  Literal(__return_storage_ptr__,(int)sVar1);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::subSatSI16(const Literal& other) const {
  return Literal(sub_sat_s<int16_t>(geti32(), other.geti32()));
}